

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetOneofFieldDescriptor
          (GeneratedMessageReflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  int key;
  FieldDescriptor *pFVar1;
  
  key = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)(((long)oneof_descriptor -
                                    *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x40)) / 0x30) *
                              4 + (this->schema_).oneof_case_offset_));
  if (key != 0) {
    pFVar1 = Descriptor::FindFieldByNumber(this->descriptor_,key);
    return pFVar1;
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* GeneratedMessageReflection::GetOneofFieldDescriptor(
    const Message& message,
    const OneofDescriptor* oneof_descriptor) const {
  uint32 field_number = GetOneofCase(message, oneof_descriptor);
  if (field_number == 0) {
    return NULL;
  }
  return descriptor_->FindFieldByNumber(field_number);
}